

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSplitDeque.h
# Opt level: O2

void __thiscall
HighsSplitDeque::waitForTaskToFinish(HighsSplitDeque *this,HighsTask *t,HighsSplitDeque *stealer)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  unique_lock<std::mutex> lg;
  unique_lock<std::mutex> local_40;
  unique_lock<std::mutex> local_30;
  
  HighsBinarySemaphore::lockMutexForAcquire((HighsBinarySemaphore *)&local_40);
  uVar1 = (t->metadata).stealer.super___atomic_base<unsigned_long>._M_i;
  do {
    LOCK();
    uVar2 = (t->metadata).stealer.super___atomic_base<unsigned_long>._M_i;
    bVar3 = uVar1 == uVar2;
    if (bVar3) {
      (t->metadata).stealer.super___atomic_base<unsigned_long>._M_i =
           uVar1 ^ (ulong)stealer ^ (ulong)this;
      uVar2 = uVar1;
    }
    UNLOCK();
    uVar1 = uVar2;
  } while (!bVar3);
  if ((uVar2 & 1) == 0) {
    local_30._M_device = local_40._M_device;
    local_30._M_owns = local_40._M_owns;
    local_40._M_device = (mutex_type *)0x0;
    local_40._M_owns = false;
    HighsBinarySemaphore::acquire(&(this->stealerData).semaphore,&local_30);
    std::unique_lock<std::mutex>::~unique_lock(&local_30);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_40);
  return;
}

Assistant:

void waitForTaskToFinish(HighsTask* t, HighsSplitDeque* stealer) {
    std::unique_lock<std::mutex> lg =
        stealerData.semaphore.lockMutexForAcquire();
    // exchange the value stored in stealer with the pointer to owner
    // so that the stealer will see this pointer instead of nullptr
    // when it stores whether the task is finished. In that case the
    // stealer will additionally acquire the wait mutex and signal the owner
    // thread that the task is finished

    if (!t->requestNotifyWhenFinished(this, stealer)) return;

    stealerData.semaphore.acquire(std::move(lg));
  }